

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O1

SIMDValue Js::SIMDUtils::SIMDLdData(SIMDValue *data,uint8 dataWidth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000031;
  SIMDValue SVar7;
  
  iVar6 = (int)CONCAT71(in_register_00000031,dataWidth);
  uVar5 = (ulong)(iVar6 << 0x1e | iVar6 - 4U >> 2);
  uVar4 = 0;
  switch(uVar5) {
  case 0:
    uVar4 = uVar5;
    break;
  case 3:
    uVar4 = (ulong)(data->field_0).u32[3] << 0x20;
  case 2:
    uVar4 = uVar4 | (data->field_0).u32[2];
  case 1:
    uVar5 = uVar4;
    uVar4 = (ulong)(data->field_0).u32[1] << 0x20;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                ,0x52,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
    goto LAB_00b0dadf;
  }
  uVar4 = (data->field_0).u32[0] | uVar4;
LAB_00b0dadf:
  SVar7.field_0.f64[1] = (Type)uVar5;
  SVar7.field_0.f64[0] = (Type)uVar4;
  return (SIMDValue)SVar7.field_0;
}

Assistant:

SIMDValue SIMDUtils::SIMDLdData(const SIMDValue *data, uint8 dataWidth)
    {
        SIMDValue result = { 0, 0, 0, 0 };
        // bitwise copy. Always use integer fields to avoid wrong copy of NaNs.
        switch (dataWidth)
        {
        case 16:
            result.i32[SIMD_W] = data->i32[SIMD_W];
            // fall through
        case 12:
            result.i32[SIMD_Z] = data->i32[SIMD_Z];
            // fall through
        case 8:
            result.i32[SIMD_Y] = data->i32[SIMD_Y];
            // fall through
        case 4:
            result.i32[SIMD_X] = data->i32[SIMD_X];
            break;
        default:
            Assert(UNREACHED);
        }
        return result;
    }